

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O3

bool __thiscall
QResourceFileEngine::extension
          (QResourceFileEngine *this,Extension extension,ExtensionOption *option,
          ExtensionReturn *output)

{
  uchar *puVar1;
  MapExtensionReturn *returnValue;
  
  if (extension == UnMapExtension) {
    return true;
  }
  if (extension == MapExtension) {
    puVar1 = QResourceFileEnginePrivate::map
                       ((QResourceFileEnginePrivate *)(this->super_QAbstractFileEngine).d_ptr.d,
                        *(qint64 *)option,*(qint64 *)(option + 8),
                        (QFlagsStorageHelper<QFileDevice::MemoryMapFlag,_4>)
                        *(QFlagsStorage<QFileDevice::MemoryMapFlag> *)(option + 0x10));
    *(uchar **)output = puVar1;
    return puVar1 != (uchar *)0x0;
  }
  return false;
}

Assistant:

bool QResourceFileEngine::extension(Extension extension, const ExtensionOption *option, ExtensionReturn *output)
{
    Q_D(QResourceFileEngine);
    if (extension == MapExtension) {
        const auto *options = static_cast<const MapExtensionOption *>(option);
        auto *returnValue = static_cast<MapExtensionReturn *>(output);
        returnValue->address = d->map(options->offset, options->size, options->flags);
        return (returnValue->address != nullptr);
    }
    if (extension == UnMapExtension) {
        const auto *options = static_cast<const UnMapExtensionOption *>(option);
        return d->unmap(options->address);
    }
    return false;
}